

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O2

void __thiscall Joytime::Controller::setVibration(Controller *this,bool vibrate)

{
  initializer_list<unsigned_char> __l;
  allocator_type local_62;
  uchar local_61;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  performUsabilityCheck(this);
  __l._M_len = 1;
  __l._M_array = &local_61;
  local_61 = vibrate;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&buf,__l,&local_62);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,&buf);
  sendSubcommand((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,this,
                 RumbleAndSubcommand,SetVibration,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void Joytime::Controller::setVibration(bool vibrate) {
  performUsabilityCheck();
  std::vector<uint8_t> buf = { (uint8_t)((vibrate) ? 1 : 0) };

  sendSubcommand(Joytime::ControllerCommand::RumbleAndSubcommand, Joytime::ControllerSubcommand::SetVibration, buf);
}